

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeletal_mesh.h
# Opt level: O0

void __thiscall
SkeletalMesh::Scene::recursivelyGetTransf
          (Scene *this,SkeletonTransf *skTransf,SkeletonModifier *modifier,aiNode *node,
          aiMatrix4x4 parentTransf,aiMatrix4x4 *invTransf)

{
  aiNode *node_00;
  aiMatrix4x4 parentTransf_00;
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  aiMatrix4x4t<float> *paVar4;
  reference __dest;
  mat<4,_4,_float,_(glm::qualifier)0> *m;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  uint local_204;
  int i;
  undefined1 local_1c0 [8];
  aiMatrix4x4 finalMtrx;
  transpose_type trans;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>
  local_138;
  undefined1 local_12c [8];
  aiMatrix4x4 boneMod;
  iterator local_c8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>
  local_c0;
  const_iterator boneModFound;
  allocator<char> local_99;
  key_type local_98;
  _Self local_78;
  const_iterator boneFound;
  aiMatrix4x4 globalTransf;
  aiMatrix4x4 *invTransf_local;
  aiNode *node_local;
  SkeletonModifier *modifier_local;
  SkeletonTransf *skTransf_local;
  Scene *this_local;
  
  aiMatrix4x4t<float>::operator*
            ((aiMatrix4x4t<float> *)&boneFound,&parentTransf,&node->mTransformation);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,(node->mName).data,&local_99);
  local_78._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       ::find(&this->nameBoneMap,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  boneModFound._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
       ::end(&this->nameBoneMap);
  bVar1 = std::operator!=(&local_78,(_Self *)&boneModFound);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&boneMod.d4,(node->mName).data,(allocator<char> *)((long)&boneMod.d3 + 3));
    local_c8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>_>
         ::find(modifier,(key_type *)&boneMod.d4);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>
    ::_Rb_tree_const_iterator(&local_c0,&local_c8);
    std::__cxx11::string::~string((string *)&boneMod.d4);
    std::allocator<char>::~allocator((allocator<char> *)((long)&boneMod.d3 + 3));
    aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)local_12c);
    trans.value[3]._8_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>_>
         ::end(modifier);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>
    ::_Rb_tree_const_iterator(&local_138,(iterator *)&trans.value[3].field_2);
    bVar1 = std::operator!=(&local_c0,&local_138);
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>
               ::operator->(&local_c0);
      glm::transpose<4,4,float,(glm::qualifier)0>
                ((transpose_type *)&finalMtrx.d3,(glm *)&ppVar2->second,m);
      memcpy(local_12c,&finalMtrx.d3,0x40);
      aiMatrix4x4t<float>::operator*=
                ((aiMatrix4x4t<float> *)&boneFound,(aiMatrix4x4t<float> *)local_12c);
    }
    aiMatrix4x4t<float>::operator*
              ((aiMatrix4x4t<float> *)&stack0xfffffffffffffe00,invTransf,
               (aiMatrix4x4t<float> *)&boneFound);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
             ::operator->(&local_78);
    paVar4 = &std::vector<SkeletalMesh::Bone,_std::allocator<SkeletalMesh::Bone>_>::operator[]
                        (&this->skeleton,(ulong)ppVar3->second)->localTransf;
    aiMatrix4x4t<float>::operator*
              ((aiMatrix4x4t<float> *)local_1c0,(aiMatrix4x4t<float> *)&stack0xfffffffffffffe00,
               paVar4);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
             ::operator->(&local_78);
    __dest = std::
             vector<glm::mat<4,_4,_float,_(glm::qualifier)0>,_std::allocator<glm::mat<4,_4,_float,_(glm::qualifier)0>_>_>
             ::operator[](skTransf,(ulong)ppVar3->second);
    paVar4 = aiMatrix4x4t<float>::Transpose((aiMatrix4x4t<float> *)local_1c0);
    memcpy(__dest,paVar4,0x40);
  }
  for (local_204 = 0; local_204 < node->mNumChildren; local_204 = local_204 + 1) {
    node_00 = node->mChildren[(int)local_204];
    memcpy(&local_248,&boneFound,0x40);
    parentTransf_00.a3 = (float)(undefined4)uStack_240;
    parentTransf_00.a4 = (float)uStack_240._4_4_;
    parentTransf_00.a1 = (float)(undefined4)local_248;
    parentTransf_00.a2 = (float)local_248._4_4_;
    parentTransf_00.b1 = (float)(undefined4)local_238;
    parentTransf_00.b2 = (float)local_238._4_4_;
    parentTransf_00.b3 = (float)(undefined4)uStack_230;
    parentTransf_00.b4 = (float)uStack_230._4_4_;
    parentTransf_00.c1 = (float)(undefined4)local_228;
    parentTransf_00.c2 = (float)local_228._4_4_;
    parentTransf_00.c3 = (float)(undefined4)uStack_220;
    parentTransf_00.c4 = (float)uStack_220._4_4_;
    parentTransf_00.d1 = (float)(undefined4)local_218;
    parentTransf_00.d2 = (float)local_218._4_4_;
    parentTransf_00.d3 = (float)(undefined4)uStack_210;
    parentTransf_00.d4 = (float)uStack_210._4_4_;
    recursivelyGetTransf(this,skTransf,modifier,node_00,parentTransf_00,invTransf);
  }
  return;
}

Assistant:

void recursivelyGetTransf(SkeletonTransf &skTransf, SkeletonModifier &modifier, aiNode *node,
                                  aiMatrix4x4 parentTransf, const aiMatrix4x4 &invTransf) const {
            aiMatrix4x4 globalTransf = parentTransf * node->mTransformation;
            Name2Bone::const_iterator boneFound = nameBoneMap.find(std::string(node->mName.data));
            if (boneFound != nameBoneMap.end()) {
                SkeletonModifier::const_iterator boneModFound = modifier.find(std::string(node->mName.data));
                aiMatrix4x4 boneMod;
                if (boneModFound != modifier.end()) {
                    auto trans = glm::transpose(boneModFound->second);
                    memcpy(&boneMod, &trans, 16 * sizeof(float));
                    globalTransf *= boneMod;
                }
                aiMatrix4x4 finalMtrx = invTransf * globalTransf * skeleton[boneFound->second].localTransf;
                memcpy(&skTransf[boneFound->second], &finalMtrx.Transpose(), sizeof(skTransf[boneFound->second]));
            }
            for (int i = 0; i < node->mNumChildren; i++) {
                recursivelyGetTransf(skTransf, modifier, node->mChildren[i], globalTransf, invTransf);
            }
        }